

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int aom_noise_strength_solver_init(aom_noise_strength_solver_t *solver,int num_bins,int bit_depth)

{
  int iVar1;
  
  if (solver != (aom_noise_strength_solver_t *)0x0) {
    (solver->eqns).x = (double *)0x0;
    *(undefined8 *)&(solver->eqns).n = 0;
    (solver->eqns).A = (double *)0x0;
    (solver->eqns).b = (double *)0x0;
    solver->num_bins = num_bins;
    solver->min_intensity = 0.0;
    solver->max_intensity = (double)~(-1 << ((byte)bit_depth & 0x1f));
    solver->total = 0.0;
    solver->num_equations = 0;
    iVar1 = equation_system_init(&solver->eqns,num_bins);
    return iVar1;
  }
  return 0;
}

Assistant:

int aom_noise_strength_solver_init(aom_noise_strength_solver_t *solver,
                                   int num_bins, int bit_depth) {
  if (!solver) return 0;
  memset(solver, 0, sizeof(*solver));
  solver->num_bins = num_bins;
  solver->min_intensity = 0;
  solver->max_intensity = (1 << bit_depth) - 1;
  solver->total = 0;
  solver->num_equations = 0;
  return equation_system_init(&solver->eqns, num_bins);
}